

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_udp_ref2(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  sockaddr_in addr;
  uv_udp_t h;
  uv_buf_t uStack_338;
  sockaddr_in sStack_328;
  uv_udp_t uStack_318;
  uv_udp_send_t uStack_240;
  uv_loop_t *puStack_100;
  sockaddr_in local_f0;
  uv_udp_t local_e0;
  
  puStack_100 = (uv_loop_t *)0x167117;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_f0);
  if (iVar1 == 0) {
    puStack_100 = (uv_loop_t *)0x167124;
    puVar2 = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x167134;
    uv_udp_init(puVar2,&local_e0);
    puStack_100 = (uv_loop_t *)0x167143;
    uv_udp_bind(&local_e0,(sockaddr *)&local_f0,0);
    puStack_100 = (uv_loop_t *)0x167155;
    uv_udp_recv_start(&local_e0,fail_cb,fail_cb);
    puStack_100 = (uv_loop_t *)0x16715d;
    uv_unref((uv_handle_t *)&local_e0);
    puStack_100 = (uv_loop_t *)0x167162;
    puVar2 = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x16716c;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_100 = (uv_loop_t *)0x167174;
    do_close(&local_e0);
    puStack_100 = (uv_loop_t *)0x167179;
    unaff_RBX = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x16718d;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_100 = (uv_loop_t *)0x167197;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_100 = (uv_loop_t *)0x16719c;
    puVar2 = uv_default_loop();
    puStack_100 = (uv_loop_t *)0x1671a4;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_100 = (uv_loop_t *)0x1671b8;
    run_test_udp_ref2_cold_1();
  }
  puStack_100 = (uv_loop_t *)run_test_udp_ref3;
  run_test_udp_ref2_cold_2();
  puStack_100 = unaff_RBX;
  uStack_338 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_328);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    uv_udp_init(puVar2,&uStack_318);
    uv_udp_send(&uStack_240,&uStack_318,&uStack_338,1,(sockaddr *)&sStack_328,req_cb);
    uv_unref((uv_handle_t *)&uStack_318);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (req_cb_called == 1) {
      do_close(&uStack_318);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001672ac;
    }
  }
  else {
    run_test_udp_ref3_cold_1();
  }
  run_test_udp_ref3_cold_2();
LAB_001672ac:
  run_test_udp_ref3_cold_3();
  req_cb_called = req_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(udp_ref2) {
  struct sockaddr_in addr;
  uv_udp_t h;
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_udp_init(uv_default_loop(), &h);
  uv_udp_bind(&h, (const struct sockaddr*) &addr, 0);
  uv_udp_recv_start(&h, (uv_alloc_cb)fail_cb, (uv_udp_recv_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}